

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_1::
createSingleAllocCallbacksTest<vkt::api::(anonymous_namespace)::Framebuffer>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *pPVar1;
  Deleter<vk::VkInstance_s_*> **ppDVar2;
  bool bVar3;
  int iVar4;
  VkAllocationCallbacks *pVVar5;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  Parameters *extraout_RDX;
  Environment rootEnv;
  AllocationCallbackRecorder objCallbacks;
  VkImageView attachments [2];
  AllocationCallbackRecorder resCallbacks;
  Resources res;
  EnvClone resEnv;
  VkFramebufferCreateInfo local_988;
  VkFramebuffer local_948;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_940;
  Environment local_920;
  Move<vk::Handle<(vk::HandleType)23>_> local_8e8;
  AllocationCallbackRecorder local_8c8;
  VkImageView local_868;
  deUint64 local_860;
  AllocationCallbackRecorder local_858;
  Resources local_7f8;
  EnvClone local_6f0;
  
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_858,pVVar5,0x80);
  pPVar1 = context->m_platformInterface;
  pDVar6 = Context::getDeviceInterface(context);
  pVVar7 = Context::getDevice(context);
  local_920.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_920.programBinaries = context->m_progCollection;
  local_920.allocationCallbacks =
       &local_858.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  local_920.maxResourceConsumers = 1;
  local_920.vkp = pPVar1;
  local_920.vkd = pDVar6;
  local_920.device = pVVar7;
  iVar4 = tcu::CommandLine::getVKDeviceId(context->m_testCtx->m_cmdLine);
  local_7f8.colorAttachment.resources.image._0_8_ = (ulong)(iVar4 - 1U) | 0x300000000;
  EnvClone::EnvClone(&local_6f0,&local_920,(Parameters *)&local_7f8,iVar4 - 1U);
  Framebuffer::Resources::Resources(&local_7f8,&local_6f0.env,extraout_RDX);
  pVVar5 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&local_8c8,pVVar5,0x80);
  local_988.pAttachments = &local_868;
  local_868.m_internal =
       local_7f8.colorAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object
       .m_internal;
  local_860 = local_7f8.depthStencilAttachment.object.super_RefBase<vk::Handle<(vk::HandleType)13>_>
              .m_data.object.m_internal;
  local_988.sType = 0x25;
  local_988.pNext = (void *)0x0;
  local_988.flags = 0;
  local_988.renderPass.m_internal =
       local_7f8.renderPass.object.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  local_988.attachmentCount = 2;
  local_988.width = 0x100;
  local_988.height = 0x100;
  local_988.layers = 1;
  ::vk::createFramebuffer
            (&local_8e8,local_6f0.env.vkd,local_6f0.env.device,&local_988,
             &local_8c8.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks);
  local_948.m_internal =
       local_8e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal;
  DStack_940.m_deviceIface =
       local_8e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_deviceIface;
  DStack_940.m_device =
       local_8e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device;
  DStack_940.m_allocator =
       local_8e8.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator;
  bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_8c8,0x1e);
  if (bVar3) {
    if (local_948.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_940,local_948);
    }
LAB_003f8467:
    bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_8c8,0);
    if (bVar3) {
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_8c8);
      Framebuffer::Resources::~Resources(&local_7f8);
      ::vk::DeviceDriver::~DeviceDriver(&local_6f0.vkd);
      if (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
        (*local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
                  (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
                   local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
      }
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
           (DestroyDeviceFunc)0x0;
      local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      ::vk::InstanceDriver::~InstanceDriver(&local_6f0.deviceRes.vki);
      if (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
          (VkInstance)0x0) {
        (*local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
          m_destroyInstance)
                  (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object,local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.
                          m_data.deleter.m_allocator);
      }
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object =
           (VkInstance_s *)0x0;
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance = (DestroyInstanceFunc)0x0;
      local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_allocator = (VkAllocationCallbacks *)0x0;
      bVar3 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_858,0);
      ppDVar2 = (Deleter<vk::VkInstance_s_*> **)
                &local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                 deleter;
      local_6f0.deviceRes.instance._0_8_ = ppDVar2;
      if (bVar3) {
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f0,"Ok","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_6f0.deviceRes.instance._0_8_,
                   local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_6f0.deviceRes.instance._0_8_);
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_6f0,"Invalid allocation callback","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->m_description).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->m_description,
                   local_6f0.deviceRes.instance._0_8_,
                   local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.
                   object + local_6f0.deviceRes.instance._0_8_);
      }
      if ((Deleter<vk::VkInstance_s_*> **)local_6f0.deviceRes.instance._0_8_ != ppDVar2) {
        operator_delete((void *)local_6f0.deviceRes.instance._0_8_,
                        (ulong)(local_6f0.deviceRes.instance.object.
                                super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_destroyInstance +
                               1));
      }
      goto LAB_003f86e5;
    }
    local_988._0_8_ = (void *)((long)&local_988 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_988,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_988._0_8_,
               (long)local_988.pNext + local_988._0_8_);
    if ((void *)local_988._0_8_ != (void *)((long)&local_988 + 0x10U)) {
      operator_delete((void *)local_988._0_8_,CONCAT44(local_988._20_4_,local_988.flags) + 1);
    }
  }
  else {
    local_988._0_8_ = (void *)((long)&local_988 + 0x10U);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_988,"Invalid allocation callback","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_988._0_8_,
               (long)local_988.pNext + local_988._0_8_);
    if ((void *)local_988._0_8_ != (void *)((long)&local_988 + 0x10U)) {
      operator_delete((void *)local_988._0_8_,CONCAT44(local_988._20_4_,local_988.flags) + 1);
    }
    if (local_948.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_940,local_948);
    }
    if (bVar3) goto LAB_003f8467;
  }
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_8c8);
  Framebuffer::Resources::~Resources(&local_7f8);
  ::vk::DeviceDriver::~DeviceDriver(&local_6f0.vkd);
  if (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object != (VkDevice)0x0) {
    (*local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice)
              (local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object,
               local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator);
  }
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.object = (VkDevice_s *)0x0;
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_destroyDevice =
       (DestroyDeviceFunc)0x0;
  local_6f0.device.super_RefBase<vk::VkDevice_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  ::vk::InstanceDriver::~InstanceDriver(&local_6f0.deviceRes.vki);
  if (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object !=
      (VkInstance)0x0) {
    (*local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
      m_destroyInstance)
              (local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object,
               local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
               m_allocator);
  }
  local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.object =
       (VkInstance_s *)0x0;
  local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.
  m_destroyInstance = (DestroyInstanceFunc)0x0;
  local_6f0.deviceRes.instance.object.super_RefBase<vk::VkInstance_s_*>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
LAB_003f86e5:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_858);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createSingleAllocCallbacksTest (Context& context, typename Object::Parameters params)
{
	const deUint32						noCmdScope		= (1u << VK_SYSTEM_ALLOCATION_SCOPE_INSTANCE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_DEVICE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_CACHE)
														| (1u << VK_SYSTEM_ALLOCATION_SCOPE_OBJECT);

	// Callbacks used by resources
	AllocationCallbackRecorder			resCallbacks	(getSystemAllocator(), 128);

	// Root environment still uses default instance and device, created without callbacks
	const Environment					rootEnv			(context.getPlatformInterface(),
														 context.getDeviceInterface(),
														 context.getDevice(),
														 context.getUniversalQueueFamilyIndex(),
														 context.getBinaryCollection(),
														 resCallbacks.getCallbacks(),
														 1u);

	{
		// Test env has instance & device created with callbacks
		const EnvClone						resEnv		(rootEnv, getDefaulDeviceParameters(context), 1u);
		const typename Object::Resources	res			(resEnv.env, params);

		// Supply a separate callback recorder just for object construction
		AllocationCallbackRecorder			objCallbacks(getSystemAllocator(), 128);
		const Environment					objEnv		(resEnv.env.vkp,
														 resEnv.env.vkd,
														 resEnv.env.device,
														 resEnv.env.queueFamilyIndex,
														 resEnv.env.programBinaries,
														 objCallbacks.getCallbacks(),
														 resEnv.env.maxResourceConsumers);

		{
			Unique<typename Object::Type>	obj	(Object::create(objEnv, res, params));

			// Validate that no command-level allocations are live
			if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, noCmdScope))
				return tcu::TestStatus::fail("Invalid allocation callback");
		}

		// At this point all allocations made against object callbacks must have been freed
		if (!validateAndLog(context.getTestContext().getLog(), objCallbacks, 0u))
			return tcu::TestStatus::fail("Invalid allocation callback");
	}

	if (!validateAndLog(context.getTestContext().getLog(), resCallbacks, 0u))
		return tcu::TestStatus::fail("Invalid allocation callback");

	return tcu::TestStatus::pass("Ok");
}